

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::DrawGridTestInstance::DrawGridTestInstance
          (DrawGridTestInstance *this,Context *context,TestFlags flags,VkBufferUsageFlags usage,
          VkDeviceSize minChunkSize)

{
  VkQueue sparseQueue;
  ulong uVar1;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  VkBufferCreateInfo referenceCreateInfo;
  MovePtr *this_00;
  SparseAllocationBuilder *pSVar2;
  VkDevice pVVar3;
  Allocator *pAVar4;
  Handle<(vk::HandleType)8> *pHVar5;
  SparseAllocation *pSVar6;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1f8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1e8;
  VkBufferCreateInfo local_1d8;
  Move<vk::Handle<(vk::HandleType)8>_> local_1a0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_180;
  VkBuffer local_160;
  Move<vk::Handle<(vk::HandleType)8>_> local_158;
  RefData<vk::Handle<(vk::HandleType)8>_> local_138;
  pointer local_118;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  local_d8;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *local_c8;
  undefined1 local_b8 [8];
  SparseAllocationBuilder builder;
  VkBufferCreateInfo referenceBufferCreateInfo;
  DeviceInterface *vk;
  VkDeviceSize minChunkSize_local;
  VkBufferUsageFlags usage_local;
  TestFlags flags_local;
  Context *context_local;
  DrawGridTestInstance *this_local;
  
  SparseBufferTestInstance::SparseBufferTestInstance
            (&this->super_SparseBufferTestInstance,context,flags);
  (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__DrawGridTestInstance_0166cbe0;
  (this->super_SparseBufferTestInstance).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__DrawGridTestInstance_0166cc10;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_stagingBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_stagingBufferAlloc);
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::MovePtr(&this->m_sparseAllocation);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_sparseBuffer);
  this_00 = (MovePtr *)
            SparseResourcesBaseInstance::getDeviceInterface((SparseResourcesBaseInstance *)this);
  SparseBufferTestInstance::getSparseBufferCreateInfo
            ((VkBufferCreateInfo *)
             &builder.m_chunksPerAllocation.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->super_SparseBufferTestInstance,usage)
  ;
  SparseAllocationBuilder::SparseAllocationBuilder((SparseAllocationBuilder *)local_b8);
  SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_b8,1);
  if (((this->super_SparseBufferTestInstance).m_residency & 1U) != 0) {
    SparseAllocationBuilder::addResourceHole((SparseAllocationBuilder *)local_b8,1);
  }
  pSVar2 = SparseAllocationBuilder::addMemoryAllocation((SparseAllocationBuilder *)local_b8);
  pSVar2 = SparseAllocationBuilder::addMemoryHole(pSVar2,1);
  SparseAllocationBuilder::addMemoryBind(pSVar2,1);
  if (((this->super_SparseBufferTestInstance).m_aliased & 1U) != 0) {
    SparseAllocationBuilder::addAliasedMemoryBind((SparseAllocationBuilder *)local_b8,0,0,1);
  }
  pVVar3 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar4 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
  local_118 = builder.m_chunksPerAllocation.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  pSVar2 = (SparseAllocationBuilder *)local_b8;
  referenceCreateInfo.pNext = (void *)referenceBufferCreateInfo._0_8_;
  referenceCreateInfo._0_8_ =
       builder.m_chunksPerAllocation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  referenceCreateInfo._16_8_ = referenceBufferCreateInfo.pNext;
  referenceCreateInfo.size = referenceBufferCreateInfo._16_8_;
  referenceCreateInfo._32_8_ = referenceBufferCreateInfo.size;
  referenceCreateInfo._40_8_ = referenceBufferCreateInfo._32_8_;
  referenceCreateInfo.pQueueFamilyIndices = (deUint32 *)referenceBufferCreateInfo._40_8_;
  SparseAllocationBuilder::build
            ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_d8,pSVar2,(DeviceInterface *)this_00,pVVar3,pAVar4,referenceCreateInfo,
             minChunkSize);
  local_c8 = de::details::MovePtr::operator_cast_to_PtrData(&local_d8,(MovePtr *)pSVar2);
  data._8_4_ = referenceBufferCreateInfo.sType;
  data._12_4_ = referenceBufferCreateInfo._4_4_;
  data.ptr = (SparseAllocation *)
             builder.m_chunksPerAllocation.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::operator=(&this->m_sparseAllocation,data);
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::~MovePtr((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_d8);
  SparseAllocationBuilder::~SparseAllocationBuilder((SparseAllocationBuilder *)local_b8);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::operator->(&(this->m_sparseAllocation).
                super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              );
  pVVar3 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeBuffer(&local_158,(DeviceInterface *)this_00,pVVar3,
             (VkBufferCreateInfo *)
             &builder.m_chunksPerAllocation.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data_01.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data_01.object.m_internal = local_138.object.m_internal;
  data_01.deleter.m_device = local_138.deleter.m_device;
  data_01.deleter.m_allocator = local_138.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_sparseBuffer,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_158);
  pVVar3 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  sparseQueue = (this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_160.m_internal = pHVar5->m_internal;
  pSVar6 = de::details::
           UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           ::operator*(&(this->m_sparseAllocation).
                        super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                      );
  bindSparseBuffer((DeviceInterface *)this_00,pVVar3,sparseQueue,local_160,pSVar6);
  pSVar6 = de::details::
           UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           ::operator->(&(this->m_sparseAllocation).
                         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                       );
  uVar1 = pSVar6->resourceSize;
  pSVar6 = de::details::
           UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           ::operator->(&(this->m_sparseAllocation).
                         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                       );
  this->m_perDrawBufferOffset = uVar1 / pSVar6->numResourceChunks;
  this->m_stagingBufferSize = this->m_perDrawBufferOffset * 2;
  pVVar3 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeBufferCreateInfo(&local_1d8,this->m_stagingBufferSize,1);
  makeBuffer(&local_1a0,(DeviceInterface *)this_00,pVVar3,&local_1d8);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_180,(Move *)&local_1a0);
  data_02.deleter.m_deviceIface = local_180.deleter.m_deviceIface;
  data_02.object.m_internal = local_180.object.m_internal;
  data_02.deleter.m_device = local_180.deleter.m_device;
  data_02.deleter.m_allocator = local_180.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_stagingBuffer,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_1a0);
  pVVar3 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar4 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1f8,
             (DeviceInterface *)this_00,pVVar3,pAVar4,(VkBuffer)pHVar5->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_1e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_1f8,this_00);
  data_00._8_8_ = local_180.deleter.m_deviceIface;
  data_00.ptr = (Allocation *)local_180.object.m_internal;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_stagingBufferAlloc,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1f8);
  return;
}

Assistant:

DrawGridTestInstance (Context& context, const TestFlags flags, const VkBufferUsageFlags usage, const VkDeviceSize minChunkSize)
		: SparseBufferTestInstance	(context, flags)
	{
		const DeviceInterface&	vk							= getDeviceInterface();
		VkBufferCreateInfo		referenceBufferCreateInfo	= getSparseBufferCreateInfo(usage);

		{
			// Allocate two chunks, each covering half of the viewport
			SparseAllocationBuilder builder;
			builder.addMemoryBind();

			if (m_residency)
				builder.addResourceHole();

			builder
				.addMemoryAllocation()
				.addMemoryHole()
				.addMemoryBind();

			if (m_aliased)
				builder.addAliasedMemoryBind(0u, 0u);

			m_sparseAllocation	= builder.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
		}

		// Create the buffer
		referenceBufferCreateInfo.size	= m_sparseAllocation->resourceSize;
		m_sparseBuffer					= makeBuffer(vk, getDevice(), referenceBufferCreateInfo);

		// Bind the memory
		bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *m_sparseBuffer, *m_sparseAllocation);

		m_perDrawBufferOffset	= m_sparseAllocation->resourceSize / m_sparseAllocation->numResourceChunks;
		m_stagingBufferSize		= 2 * m_perDrawBufferOffset;
		m_stagingBuffer			= makeBuffer(vk, getDevice(), makeBufferCreateInfo(m_stagingBufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT));
		m_stagingBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_stagingBuffer, MemoryRequirement::HostVisible);
	}